

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::FunctionObject::unary<tcu::Matrix<double,_4,_3>,_tcu::Matrix<double,_3,_4>_>::call
          (unary<tcu::Matrix<double,_4,_3>,_tcu::Matrix<double,_3,_4>_> *this,GLvoid *result_dst,
          GLvoid *argument_src)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  int row_2;
  undefined1 *puVar4;
  GLdouble *data;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  bool bVar10;
  undefined8 uVar11;
  Matrix<double,_3,_4> arg;
  Matrix<double,_4,_3> result;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined8 local_d8 [13];
  undefined1 local_70 [96];
  long lVar9;
  
  puVar4 = local_138;
  puVar3 = local_d8 + 4;
  local_d8[10] = 0;
  local_d8[0xb] = 0;
  local_d8[8] = 0;
  local_d8[9] = 0;
  local_d8[6] = 0;
  local_d8[7] = 0;
  local_d8[4] = 0;
  local_d8[5] = 0;
  local_d8[2] = 0;
  local_d8[3] = 0;
  local_d8[0] = 0;
  local_d8[1] = 0;
  lVar5 = 0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    auVar8 = _DAT_019f34d0;
    do {
      bVar10 = SUB164(auVar8 ^ _DAT_019ec5b0,4) == DAT_01a3c1d0._4_4_ &&
               SUB164(auVar8 ^ _DAT_019ec5b0,0) < DAT_01a3c1d0;
      if (bVar10) {
        uVar11 = 0x3ff0000000000000;
        if (lVar5 != lVar7) {
          uVar11 = 0;
        }
        *(undefined8 *)((long)puVar3 + lVar7 + -0x20) = uVar11;
      }
      if (bVar10) {
        uVar11 = 0x3ff0000000000000;
        if (lVar5 + -0x20 != lVar7) {
          uVar11 = 0;
        }
        *(undefined8 *)((long)puVar3 + lVar7) = uVar11;
      }
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar9 + 2;
      lVar7 = lVar7 + 0x40;
    } while (lVar7 != 0x80);
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 0x20;
    puVar3 = puVar3 + 1;
  } while (lVar6 != 4);
  local_e8 = (undefined1  [16])0x0;
  local_f8 = (undefined1  [16])0x0;
  local_108 = (undefined1  [16])0x0;
  local_118 = (undefined1  [16])0x0;
  local_128 = (undefined1  [16])0x0;
  local_138 = (undefined1  [16])0x0;
  lVar5 = 0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      uVar11 = 0x3ff0000000000000;
      if (lVar5 != lVar7) {
        uVar11 = 0;
      }
      *(undefined8 *)(puVar4 + lVar7) = uVar11;
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x60);
    lVar6 = lVar6 + 1;
    puVar4 = puVar4 + 8;
    lVar5 = lVar5 + 0x18;
  } while (lVar6 != 3);
  lVar5 = 0;
  do {
    *(undefined8 *)(local_128 + lVar5) = *(undefined8 *)((long)argument_src + lVar5 + 0x10);
    uVar11 = ((undefined8 *)((long)argument_src + lVar5))[1];
    *(undefined8 *)(local_138 + lVar5) = *(undefined8 *)((long)argument_src + lVar5);
    *(undefined8 *)(local_138 + lVar5 + 8) = uVar11;
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x60);
  puVar4 = local_70;
  (*(code *)(this->super_unaryBase).super_functionObject.m_p_function)(puVar4,local_138);
  puVar3 = local_d8;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      *(undefined8 *)((long)puVar3 + lVar6) = *(undefined8 *)(puVar4 + lVar6);
      lVar6 = lVar6 + 0x20;
    } while (lVar6 != 0x60);
    lVar5 = lVar5 + 1;
    puVar3 = puVar3 + 1;
    puVar4 = puVar4 + 8;
  } while (lVar5 != 4);
  lVar5 = 0;
  do {
    uVar11 = *(undefined8 *)((long)local_d8 + lVar5);
    uVar1 = *(undefined8 *)((long)local_d8 + lVar5 + 8);
    uVar2 = *(undefined8 *)((long)local_d8 + lVar5 + 0x18);
    puVar3 = (undefined8 *)((long)result_dst + lVar5 + 0x10);
    *puVar3 = *(undefined8 *)((long)local_d8 + lVar5 + 0x10);
    puVar3[1] = uVar2;
    *(undefined8 *)((long)result_dst + lVar5) = uVar11;
    ((undefined8 *)((long)result_dst + lVar5))[1] = uVar1;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0x60);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}